

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool ifhunyise(int tongse_num,int zipai_num)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char cVar4;
  bool bVar5;
  _Alloc_hider *p_Var6;
  uint uVar7;
  pointer pbVar8;
  pointer pbVar9;
  mapped_type *pmVar10;
  uint uVar11;
  __node_base *p_Var12;
  uint uVar13;
  int i;
  int iVar14;
  string local_50;
  
  uVar7 = 0;
  p_Var12 = &my_active_card_abi_cxx11_._M_h._M_before_begin;
  uVar13 = 0;
  uVar11 = 0;
  while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
    cVar1 = *(char *)&(p_Var12[1]._M_nxt)->_M_nxt;
    uVar7 = uVar7 + (cVar1 == 'W');
    uVar13 = uVar13 + (cVar1 == 'B');
    uVar11 = uVar11 + (cVar1 == 'T');
  }
  uVar3 = uVar11;
  if ((int)uVar11 < (int)uVar13) {
    uVar3 = uVar13;
  }
  cVar1 = 'B';
  if (uVar13 < uVar11) {
    cVar1 = 'T';
  }
  pbVar9 = peng_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cVar4 = 'W';
  if (uVar7 < uVar3) {
    cVar4 = cVar1;
  }
  do {
    pbVar8 = chi_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar9 == peng_abi_cxx11_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00112b67;
    p_Var6 = &pbVar9->_M_dataplus;
    pbVar9 = pbVar9 + 1;
  } while (*p_Var6->_M_p == cVar4);
  goto LAB_00112b97;
  while (p_Var6 = &pbVar8->_M_dataplus, pbVar8 = pbVar8 + 1, *p_Var6->_M_p == cVar4) {
LAB_00112b67:
    pbVar9 = gang_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar8 == chi_abi_cxx11_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00112b87;
  }
  goto LAB_00112b97;
  while (p_Var6 = &pbVar9->_M_dataplus, pbVar9 = pbVar9 + 1, *p_Var6->_M_p == cVar4) {
LAB_00112b87:
    if (pbVar9 == gang_abi_cxx11_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      bVar5 = false;
      for (iVar14 = 1; iVar14 != 4; iVar14 = iVar14 + 1) {
        makeCardName_abi_cxx11_(&local_50,'J',iVar14);
        pmVar10 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&my_active_card_abi_cxx11_,&local_50);
        iVar2 = *pmVar10;
        std::__cxx11::string::~string((string *)&local_50);
        if (zipai_num <= iVar2) {
          bVar5 = true;
        }
      }
      for (iVar14 = 1; iVar14 != 5; iVar14 = iVar14 + 1) {
        makeCardName_abi_cxx11_(&local_50,'F',iVar14);
        pmVar10 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&my_active_card_abi_cxx11_,&local_50);
        iVar2 = *pmVar10;
        std::__cxx11::string::~string((string *)&local_50);
        if (zipai_num <= iVar2) {
          bVar5 = true;
        }
      }
      uVar7 = 0;
      if (bVar5) {
        p_Var12 = &my_active_card_abi_cxx11_._M_h._M_before_begin;
        while (p_Var12 = p_Var12->_M_nxt,
              pbVar9 = peng_abi_cxx11_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start, p_Var12 != (__node_base *)0x0) {
          if (*(char *)&(p_Var12[1]._M_nxt)->_M_nxt == cVar4) {
            uVar7 = uVar7 + *(int *)&p_Var12[5]._M_nxt;
          }
        }
        for (; pbVar8 = chi_abi_cxx11_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
            pbVar9 != peng_abi_cxx11_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
          uVar11 = uVar7 + 3;
          if (*(pbVar9->_M_dataplus)._M_p != cVar4) {
            uVar11 = uVar7;
          }
          uVar7 = uVar11;
        }
        for (; pbVar9 = gang_abi_cxx11_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
            pbVar8 != chi_abi_cxx11_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
          uVar11 = uVar7 + 3;
          if (*(pbVar8->_M_dataplus)._M_p != cVar4) {
            uVar11 = uVar7;
          }
          uVar7 = uVar11;
        }
        for (; pbVar9 != gang_abi_cxx11_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
          uVar11 = uVar7 + 3;
          if (*(pbVar9->_M_dataplus)._M_p != cVar4) {
            uVar11 = uVar7;
          }
          uVar7 = uVar11;
        }
        uVar7 = (uint)(tongse_num <= (int)uVar7);
      }
      goto LAB_00112b99;
    }
  }
LAB_00112b97:
  uVar7 = 0;
LAB_00112b99:
  return SUB41(uVar7,0);
}

Assistant:

bool ifhunyise( int tongse_num, int zipai_num) {
	int tiao = 0, bin = 0, wan = 0;
	for (auto it = my_active_card.begin(); it != my_active_card.end(); it++) {
		if (it->first[0] == 'W') wan++;
		if (it->first[0] == 'B') bin++;
		if (it->first[0] == 'T') tiao++;
	}
	char max = 'n';
	int maxnum = 0;
	if (tiao >= maxnum) {
		max = 'T';
		maxnum = tiao;
	}
	if (bin >= maxnum) {
		max = 'B';
		maxnum = bin;
	}
	if (wan >= maxnum) {
		max = 'W';
		maxnum = wan;
	}
	//return max;
	char huase = max;
	for (auto it = peng.begin(); it != peng.end(); it++) {
		if ((*it)[0] != huase) return false;
	}
	for (auto it = chi.begin(); it != chi.end(); it++) {
		if ((*it)[0] != huase) return false;
	}
	for (auto it = gang.begin(); it != gang.end(); it++) {
		if ((*it)[0] != huase) return false;
	}

	int flag = 0;
	for (int i = 1; i <= 3; i++) {
		if (my_active_card[makeCardName('J', i)] >= zipai_num) flag = 1;
	}
	for (int i = 1; i <= 4; i++) {
		if (my_active_card[makeCardName('F', i)] >= zipai_num) flag = 1;
	}
	if (flag == 0) return false;

	int counter = 0;
	for (auto it = my_active_card.begin(); it != my_active_card.end(); it++) {
		if (it->first[0] == huase) {
			counter += it->second;
		}
	}

	for (auto it = peng.begin(); it != peng.end(); it++) {
		if ((*it)[0] == huase) counter += 3;
	}
	for (auto it = chi.begin(); it != chi.end(); it++) {
		if ((*it)[0] == huase) counter += 3;
	}
	for (auto it = gang.begin(); it != gang.end(); it++) {
		if ((*it)[0] == huase) counter += 3;
	}

	if (counter >= tongse_num) return true;
	return false;
}